

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Device_List.cpp
# Opt level: O3

bool __thiscall
SRUP_MSG_SYNDICATED_DEV_LIST::DeSerialize(SRUP_MSG_SYNDICATED_DEV_LIST *this,uint8_t *serial_data)

{
  uint32_t uVar1;
  uint64_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint64_t *puVar5;
  uint8_t *puVar6;
  uint32_t *puVar7;
  ulong __n;
  long lVar8;
  uint8_t bytes [2];
  undefined2 local_2a;
  
  *(this->super_SRUP_MSG).m_version = *serial_data;
  *(this->super_SRUP_MSG).m_msgtype = serial_data[1];
  uVar2 = *(uint64_t *)(serial_data + 2);
  puVar5 = (this->super_SRUP_MSG).m_sequence_ID;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete(puVar5);
  }
  puVar5 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG).m_sequence_ID = puVar5;
  *puVar5 = uVar2;
  uVar2 = *(uint64_t *)(serial_data + 10);
  puVar5 = (this->super_SRUP_MSG).m_sender_ID;
  if (puVar5 != (uint64_t *)0x0) {
    operator_delete(puVar5);
  }
  puVar5 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG).m_sender_ID = puVar5;
  *puVar5 = uVar2;
  local_2a = *(undefined2 *)(serial_data + 0x12);
  uVar3 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  puVar6 = (this->super_SRUP_MSG).m_token;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  puVar6 = (uint8_t *)operator_new__((ulong)(uVar3 + 1));
  (this->super_SRUP_MSG).m_token = puVar6;
  memcpy(puVar6,serial_data + 0x14,(ulong)uVar3);
  (this->super_SRUP_MSG).m_token_len = uVar3;
  local_2a = *(undefined2 *)(serial_data + (ulong)uVar3 + 0x14);
  uVar4 = SRUP_MSG::decodeLength((uint8_t *)&local_2a);
  (this->super_SRUP_MSG).m_sig_len = uVar4;
  puVar6 = (this->super_SRUP_MSG).m_signature;
  if (puVar6 != (uint8_t *)0x0) {
    operator_delete__(puVar6);
  }
  __n = (ulong)uVar4;
  puVar6 = (uint8_t *)operator_new__(__n);
  (this->super_SRUP_MSG).m_signature = puVar6;
  memcpy(puVar6,serial_data + (ulong)uVar3 + 0x16,__n);
  lVar8 = uVar3 + __n;
  uVar1 = *(uint32_t *)(serial_data + lVar8 + 0x16);
  operator_delete(this->m_device_sequence);
  puVar7 = (uint32_t *)operator_new(4);
  this->m_device_sequence = puVar7;
  *puVar7 = uVar1;
  uVar2 = *(uint64_t *)(serial_data + lVar8 + 0x1a);
  operator_delete(this->m_device_ID);
  puVar5 = (uint64_t *)operator_new(8);
  this->m_device_ID = puVar5;
  *puVar5 = uVar2;
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATED_DEV_LIST::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    uint8_t sid_bytes[8];
    for (int i=0;i<8;i++)
    {
        std::memcpy(&sid_bytes[i], (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Next we have to unmarshall the sender ID...
    uint8_t snd_bytes[8];
    for (int i=0;i<8;i++)
    {
        std::memcpy(&snd_bytes[i], (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into the sender ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now we have two-bytes for the size of the token ... and x bytes for the token
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    if(m_token != nullptr)
        delete[] m_token;
    m_token = new uint8_t[x+1];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    if(m_signature != nullptr)
        delete[] m_signature;
    m_signature = new uint8_t[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Next we have four bytes for the device sequence.
    uint8_t ds_bytes[4];
    for (unsigned char & ds_byte : ds_bytes)
    {
        std::memcpy(&ds_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    delete(m_device_sequence);
    m_device_sequence = new uint32_t;
    std::memcpy(m_device_sequence, ds_bytes, 4);

    // And finally the device ID.
    uint8_t did_bytes[8];
    for (unsigned char & did_byte : did_bytes)
    {
        std::memcpy(&did_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    delete(m_device_ID);
    m_device_ID = new uint64_t;
    std::memcpy(m_device_ID, did_bytes, 8);

    return true;
}